

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomwalk.cpp
# Opt level: O0

void __thiscall
RandomWalk::RandomWalk
          (RandomWalk *this,double *sigma,double *dt,uint *nthreads,size_t *n,size_t *nsteps,
          uint32_t *seed)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  uint *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  Rng *in_RDI;
  long *in_R8;
  long *in_R9;
  uint i;
  value_type *in_stack_ffffffffffffbf88;
  uint32_t *this_00;
  undefined1 local_403c [16392];
  uint local_34;
  long *local_30;
  long *local_28;
  uint *local_20;
  
  in_RDI->Q_[0] = 0;
  in_RDI->Q_[1] = 0;
  *(undefined8 *)(in_RDI->Q_ + 2) = *in_RSI;
  *(undefined8 *)(in_RDI->Q_ + 4) = *in_RDX;
  *(long *)(in_RDI->Q_ + 6) = *in_R8;
  *(long *)(in_RDI->Q_ + 8) = *in_R9;
  *(ulong *)(in_RDI->Q_ + 10) = (ulong)*in_RCX;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  std::vector<Rng,_std::allocator<Rng>_>::vector((vector<Rng,_std::allocator<Rng>_> *)0x10537f);
  for (local_34 = 0; local_34 < *local_20; local_34 = local_34 + 1) {
    this_00 = in_RDI->Q_ + 0xc;
    Rng::Rng(in_RDI,(uint32_t)((ulong)local_403c >> 0x20));
    std::vector<Rng,_std::allocator<Rng>_>::push_back
              ((vector<Rng,_std::allocator<Rng>_> *)this_00,in_stack_ffffffffffffbf88);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *local_28 * *local_30;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pvVar3 = operator_new__(uVar2);
  *(void **)in_RDI->Q_ = pvVar3;
  return;
}

Assistant:

RandomWalk::RandomWalk(const double & sigma, const double & dt,const unsigned int &nthreads, const size_t & n, const size_t & nsteps, const uint32_t &seed) : sigma{sigma},dt{dt}, data{nullptr}, n{n}, nsteps{nsteps}, nthreads{nthreads}
{
    for (unsigned int i=0;i<nthreads;++i) {
        rnd.push_back(Rng(seed+i));
    }
    data=new double[n*nsteps];
}